

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int apply_to_counts(hdr_histogram *h,int32_t word_size,uint8_t *counts_data,int32_t counts_limit)

{
  int32_t counts_limit_local;
  uint8_t *counts_data_local;
  int32_t word_size_local;
  hdr_histogram *h_local;
  
  switch(word_size) {
  case 1:
    h_local._4_4_ = apply_to_counts_zz(h,counts_data,counts_limit);
    break;
  case 2:
    apply_to_counts_16(h,(int16_t *)counts_data,counts_limit);
    h_local._4_4_ = 0;
    break;
  default:
    h_local._4_4_ = -1;
    break;
  case 4:
    apply_to_counts_32(h,(int32_t *)counts_data,counts_limit);
    h_local._4_4_ = 0;
    break;
  case 8:
    apply_to_counts_64(h,(int64_t *)counts_data,counts_limit);
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

static int apply_to_counts(
    struct hdr_histogram* h, const int32_t word_size, const uint8_t* counts_data, const int32_t counts_limit)
{
    switch (word_size)
    {
        case 2:
            apply_to_counts_16(h, (const int16_t*) counts_data, counts_limit);
            return 0;

        case 4:
            apply_to_counts_32(h, (const int32_t*) counts_data, counts_limit);
            return 0;

        case 8:
            apply_to_counts_64(h, (const int64_t*) counts_data, counts_limit);
            return 0;

        case 1:
            return apply_to_counts_zz(h, counts_data, counts_limit);

        default:
            return -1;
    }
}